

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.c
# Opt level: O1

uchar * glfwGetJoystickButtons(int jid,int *count)

{
  int iVar1;
  
  if (jid < 0) {
    __assert_fail("jid >= GLFW_JOYSTICK_1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/glfw/src/input.c"
                  ,0x3c8,"const unsigned char *glfwGetJoystickButtons(int, int *)");
  }
  if (0xf < jid) {
    __assert_fail("jid <= GLFW_JOYSTICK_LAST",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/glfw/src/input.c"
                  ,0x3c9,"const unsigned char *glfwGetJoystickButtons(int, int *)");
  }
  if (count == (int *)0x0) {
    __assert_fail("count != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/glfw/src/input.c"
                  ,0x3ca,"const unsigned char *glfwGetJoystickButtons(int, int *)");
  }
  *count = 0;
  if (_glfw.initialized == 0) {
    _glfwInputError(0x10001,(char *)0x0);
  }
  else if ((_glfw.joysticks[(uint)jid].present != 0) &&
          (iVar1 = _glfwPlatformPollJoystick(_glfw.joysticks + (uint)jid,2), iVar1 != 0)) {
    iVar1 = _glfw.joysticks[(uint)jid].buttonCount;
    if (_glfw.hints.init.hatButtons != 0) {
      iVar1 = iVar1 + _glfw.joysticks[(uint)jid].hatCount * 4;
    }
    *count = iVar1;
    return _glfw.joysticks[(uint)jid].buttons;
  }
  return (uchar *)0x0;
}

Assistant:

char* glfwGetJoystickButtons(int jid, int* count)
{
    _GLFWjoystick* js;

    assert(jid >= GLFW_JOYSTICK_1);
    assert(jid <= GLFW_JOYSTICK_LAST);
    assert(count != NULL);

    *count = 0;

    _GLFW_REQUIRE_INIT_OR_RETURN(NULL);

    if (jid < 0 || jid > GLFW_JOYSTICK_LAST)
    {
        _glfwInputError(GLFW_INVALID_ENUM, "Invalid joystick ID %i", jid);
        return NULL;
    }

    js = _glfw.joysticks + jid;
    if (!js->present)
        return NULL;

    if (!_glfwPlatformPollJoystick(js, _GLFW_POLL_BUTTONS))
        return NULL;

    if (_glfw.hints.init.hatButtons)
        *count = js->buttonCount + js->hatCount * 4;
    else
        *count = js->buttonCount;

    return js->buttons;
}